

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O1

Load * __thiscall
wasm::Builder::makeLoad
          (Builder *this,uint bytes,bool signed_,Address offset,uint align,Expression *ptr,Type type
          ,Name memory)

{
  Load *this_00;
  
  this_00 = (Load *)MixedArena::allocSpace(&this->wasm->allocator,0x48,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression._id = LoadId;
  (this_00->offset).addr = 0;
  (this_00->align).addr = 0;
  this_00->isAtomic = false;
  this_00->bytes = (uint8_t)bytes;
  this_00->signed_ = signed_;
  (this_00->offset).addr = offset.addr;
  (this_00->align).addr = (ulong)align;
  this_00->ptr = ptr;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id = type.id;
  (this_00->memory).super_IString.str._M_len = memory.super_IString.str._M_len;
  (this_00->memory).super_IString.str._M_str = memory.super_IString.str._M_str;
  Load::finalize(this_00);
  return this_00;
}

Assistant:

Load* makeLoad(unsigned bytes,
                 bool signed_,
                 Address offset,
                 unsigned align,
                 Expression* ptr,
                 Type type,
                 Name memory) {
    auto* ret = wasm.allocator.alloc<Load>();
    ret->isAtomic = false;
    ret->bytes = bytes;
    ret->signed_ = signed_;
    ret->offset = offset;
    ret->align = align;
    ret->ptr = ptr;
    ret->type = type;
    ret->memory = memory;
    ret->finalize();
    return ret;
  }